

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_0::SSLTest_ClientCAList_Test::TestBody(SSLTest_ClientCAList_Test *this)

{
  _Head_base<0UL,_stack_st_X509_NAME_*,_false> name_list;
  _Head_base<0UL,_X509_name_st_*,_false> p;
  SSL_METHOD *meth;
  size_t sVar1;
  OPENSSL_STACK *sk;
  X509_NAME *a;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar2;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  UniquePtr<struct_stack_st_X509_NAME> stack;
  AssertionResult gtest_ar;
  UniquePtr<X509_NAME> name_dup;
  UniquePtr<X509_NAME> name;
  UniquePtr<SSL> ssl;
  UniquePtr<SSL_CTX> ctx;
  AssertHelper local_80;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  _Head_base<0UL,_stack_st_X509_NAME_*,_false> local_68;
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _Head_base<0UL,_X509_name_st_*,_false> local_40;
  _Head_base<0UL,_X509_name_st_*,_false> local_38;
  AssertHelper local_30;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_28;
  _Head_base<0UL,_X509_name_st_*,_false> local_20;
  unique_ptr<ssl_ctx_st,_bssl::internal::Deleter> local_18;
  
  meth = (SSL_METHOD *)TLS_method();
  local_18._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)SSL_CTX_new(meth);
  local_78._M_head_impl._0_1_ =
       (internal)
       ((tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
        local_18._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0);
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
      local_18._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&local_28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_60,(internal *)&local_78,(AssertionResult *)0x3442d9,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x6c9,(char *)CONCAT71(local_60._1_7_,local_60[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_38,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
    }
    if ((SSL *)local_28._M_head_impl != (SSL *)0x0) {
      (**(code **)(*(long *)local_28._M_head_impl + 8))();
    }
    if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,local_70);
    }
    goto LAB_001625bc;
  }
  local_28._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       SSL_new((SSL_CTX *)
               local_18._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl);
  local_78._M_head_impl._0_1_ = (internal)((SSL *)local_28._M_head_impl != (SSL *)0x0);
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((SSL *)local_28._M_head_impl == (SSL *)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_60,(internal *)&local_78,(AssertionResult *)0x350267,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x6cb,(char *)CONCAT71(local_60._1_7_,local_60[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
    }
    if (local_38._M_head_impl != (X509_name_st *)0x0) {
      (*(code *)*(char ***)((local_38._M_head_impl)->entries + 8))();
    }
    if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_70,local_70);
    }
  }
  else {
    local_38._M_head_impl = (X509_name_st *)X509_NAME_new();
    local_78._M_head_impl._0_1_ = (internal)(local_38._M_head_impl != (X509_name_st *)0x0);
    local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_38._M_head_impl == (X509_name_st *)0x0) {
      testing::Message::Message((Message *)&local_40);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_60,(internal *)&local_78,(AssertionResult *)0x34aab0,"false","true"
                 ,in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x6ce,(char *)CONCAT71(local_60._1_7_,local_60[0]));
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,(Message *)&local_40);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1);
      }
      if (local_40._M_head_impl != (X509_name_st *)0x0) {
        (*(code *)*(char ***)((local_40._M_head_impl)->entries + 8))();
      }
      if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_70,local_70);
      }
    }
    else {
      local_40._M_head_impl = (X509_name_st *)X509_NAME_dup((X509_NAME *)local_38._M_head_impl);
      local_78._M_head_impl._0_1_ = (internal)(local_40._M_head_impl != (X509_name_st *)0x0);
      local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_40._M_head_impl == (X509_name_st *)0x0) {
        testing::Message::Message((Message *)&local_68);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_60,(internal *)&local_78,(AssertionResult *)"name_dup","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_80,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x6d1,(char *)CONCAT71(local_60._1_7_,local_60[0]));
        testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_80);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_60._1_7_,local_60[0]),local_50._M_allocated_capacity + 1
                         );
        }
        if ((OPENSSL_STACK *)local_68._M_head_impl != (OPENSSL_STACK *)0x0) {
          (**(code **)(*(long *)local_68._M_head_impl + 8))();
        }
        if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_70,local_70);
        }
      }
      else {
        local_68._M_head_impl = (stack_st_X509_NAME *)OPENSSL_sk_new_null();
        p._M_head_impl = local_40._M_head_impl;
        local_78._M_head_impl._0_1_ =
             (internal)((OPENSSL_STACK *)local_68._M_head_impl != (OPENSSL_STACK *)0x0);
        local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((OPENSSL_STACK *)local_68._M_head_impl == (OPENSSL_STACK *)0x0) {
          testing::Message::Message((Message *)&local_80);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_60,(internal *)&local_78,(AssertionResult *)"stack","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_30,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x6d4,(char *)CONCAT71(local_60._1_7_,local_60[0]));
          testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_80);
LAB_0016254d:
          this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_70;
          testing::internal::AssertHelper::~AssertHelper(&local_30);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_60._1_7_,local_60[0]) != &local_50) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_60._1_7_,local_60[0]),
                            local_50._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(local_80.data_._4_4_,(int)local_80.data_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_80.data_._4_4_,(int)local_80.data_) + 8))();
          }
          local_58 = local_70;
          if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
LAB_0016258f:
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()(this_00,local_58);
          }
        }
        else {
          local_20._M_head_impl = local_40._M_head_impl;
          local_40._M_head_impl = (X509_name_st *)0x0;
          sVar1 = OPENSSL_sk_push((OPENSSL_STACK *)local_68._M_head_impl,p._M_head_impl);
          if (sVar1 != 0) {
            local_20._M_head_impl = (X509_name_st *)0x0;
          }
          local_78._M_head_impl._0_1_ = (internal)(sVar1 != 0);
          local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&local_20);
          if (local_78._M_head_impl._0_1_ == (internal)0x0) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_60,(internal *)&local_78,
                       (AssertionResult *)"PushToStack(stack.get(), std::move(name_dup))","false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_30,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x6d5,(char *)CONCAT71(local_60._1_7_,local_60[0]));
            testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_80);
            goto LAB_0016254d;
          }
          if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_70,local_70);
          }
          name_list._M_head_impl = local_68._M_head_impl;
          local_68._M_head_impl = (stack_st_X509_NAME *)0x0;
          SSL_set_client_CA_list
                    ((SSL *)local_28._M_head_impl,(stack_st_X509_NAME *)name_list._M_head_impl);
          sk = (OPENSSL_STACK *)SSL_get_client_CA_list((SSL *)local_28._M_head_impl);
          local_78._M_head_impl._0_1_ = (internal)(sk != (OPENSSL_STACK *)0x0);
          local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (sk == (OPENSSL_STACK *)0x0) {
            testing::Message::Message((Message *)&local_80);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)local_60,(internal *)&local_78,(AssertionResult *)"result","false",
                       "true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_30,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x6db,(char *)CONCAT71(local_60._1_7_,local_60[0]));
            testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_80);
            goto LAB_0016254d;
          }
          local_80.data_._0_4_ = 1;
          local_78._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               OPENSSL_sk_num(sk);
          testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                    ((internal *)local_60,"1u","sk_X509_NAME_num(result)",(uint *)&local_80,
                     (unsigned_long *)&local_78);
          if (local_60[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_78);
            if (local_58 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              pcVar2 = "";
            }
            else {
              pcVar2 = (local_58->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_80,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x6dc,pcVar2);
            testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
LAB_0016264b:
            testing::internal::AssertHelper::~AssertHelper(&local_80);
            if (local_78._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_78._M_head_impl + 8))();
            }
          }
          else {
            if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               ) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_58,local_58);
            }
            local_78._M_head_impl = local_78._M_head_impl & 0xffffffff00000000;
            a = (X509_NAME *)OPENSSL_sk_value(sk,0);
            local_80.data_._0_4_ = X509_NAME_cmp(a,(X509_NAME *)local_38._M_head_impl);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)local_60,"0",
                       "X509_NAME_cmp(sk_X509_NAME_value(result, 0), name.get())",(int *)&local_78,
                       (int *)&local_80);
            if (local_60[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_78);
              if (local_58 ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = (local_58->_M_dataplus)._M_p;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_80,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x6dd,pcVar2);
              testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
              goto LAB_0016264b;
            }
          }
          if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_58;
            goto LAB_0016258f;
          }
        }
        std::unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<stack_st_X509_NAME,_bssl::internal::Deleter> *)&local_68);
      }
      std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&local_40);
    }
    std::unique_ptr<X509_name_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<X509_name_st,_bssl::internal::Deleter> *)&local_38);
  }
  std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_st,_bssl::internal::Deleter> *)&local_28);
LAB_001625bc:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&local_18);
  return;
}

Assistant:

TEST(SSLTest, ClientCAList) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);
  bssl::UniquePtr<SSL> ssl(SSL_new(ctx.get()));
  ASSERT_TRUE(ssl);

  bssl::UniquePtr<X509_NAME> name(X509_NAME_new());
  ASSERT_TRUE(name);

  bssl::UniquePtr<X509_NAME> name_dup(X509_NAME_dup(name.get()));
  ASSERT_TRUE(name_dup);

  bssl::UniquePtr<STACK_OF(X509_NAME)> stack(sk_X509_NAME_new_null());
  ASSERT_TRUE(stack);
  ASSERT_TRUE(PushToStack(stack.get(), std::move(name_dup)));

  // |SSL_set_client_CA_list| takes ownership.
  SSL_set_client_CA_list(ssl.get(), stack.release());

  STACK_OF(X509_NAME) *result = SSL_get_client_CA_list(ssl.get());
  ASSERT_TRUE(result);
  ASSERT_EQ(1u, sk_X509_NAME_num(result));
  EXPECT_EQ(0, X509_NAME_cmp(sk_X509_NAME_value(result, 0), name.get()));
}